

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

void Abc_NtkDfsNets_rec(Abc_Obj_t *pNet,Vec_Ptr_t *vNets)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  long *plVar5;
  void *pvVar6;
  void **ppvVar7;
  int in_EDX;
  int Fill;
  int iVar8;
  long lVar9;
  
  if ((*(uint *)&pNet->field_0x14 & 0xf) != 6) {
    __assert_fail("Abc_ObjIsNet(pNet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                  ,0x2e4,"void Abc_NtkDfsNets_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  pAVar3 = pNet->pNtk;
  iVar8 = pNet->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar8 + 1,in_EDX);
  if (((long)iVar8 < 0) || ((pAVar3->vTravIds).nSize <= iVar8)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar4 = pNet->pNtk;
  iVar1 = pAVar4->nTravIds;
  if ((pAVar3->vTravIds).pArray[iVar8] != iVar1) {
    iVar8 = pNet->Id;
    Vec_IntFillExtra(&pAVar4->vTravIds,iVar8 + 1,Fill);
    if (((long)iVar8 < 0) || ((pAVar4->vTravIds).nSize <= iVar8)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar4->vTravIds).pArray[iVar8] = iVar1;
    plVar5 = (long *)pNet->pNtk->vObjs->pArray[*(pNet->vFanins).pArray];
    if (0 < *(int *)((long)plVar5 + 0x1c)) {
      lVar9 = 0;
      do {
        Abc_NtkDfsNets_rec(*(Abc_Obj_t **)
                            (*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                            (long)*(int *)(plVar5[4] + lVar9 * 4) * 8),vNets);
        lVar9 = lVar9 + 1;
      } while (lVar9 < *(int *)((long)plVar5 + 0x1c));
    }
    if (0 < *(int *)((long)plVar5 + 0x2c)) {
      lVar9 = 0;
      do {
        pvVar6 = *(void **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                           (long)*(int *)(plVar5[6] + lVar9 * 4) * 8);
        uVar2 = vNets->nCap;
        if (vNets->nSize == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (vNets->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc(0x80);
            }
            else {
              ppvVar7 = (void **)realloc(vNets->pArray,0x80);
            }
            vNets->pArray = ppvVar7;
            iVar8 = 0x10;
          }
          else {
            iVar8 = uVar2 * 2;
            if (iVar8 <= (int)uVar2) goto LAB_0083b939;
            if (vNets->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar7 = (void **)realloc(vNets->pArray,(ulong)uVar2 << 4);
            }
            vNets->pArray = ppvVar7;
          }
          vNets->nCap = iVar8;
        }
LAB_0083b939:
        iVar8 = vNets->nSize;
        vNets->nSize = iVar8 + 1;
        vNets->pArray[iVar8] = pvVar6;
        lVar9 = lVar9 + 1;
      } while (lVar9 < *(int *)((long)plVar5 + 0x2c));
    }
  }
  return;
}

Assistant:

void Abc_NtkDfsNets_rec( Abc_Obj_t * pNet, Vec_Ptr_t * vNets )
{
    Abc_Obj_t * pNext;
    Abc_Obj_t * pNode; int i;
    assert( Abc_ObjIsNet(pNet) );
    if ( Abc_NodeIsTravIdCurrent( pNet ) )
        return;
    Abc_NodeSetTravIdCurrent( pNet );
    pNode = Abc_ObjFanin0( pNet );
    Abc_ObjForEachFanin( pNode, pNext, i )
        Abc_NtkDfsNets_rec( pNext, vNets );
    Abc_ObjForEachFanout( pNode, pNext, i )
        Vec_PtrPush( vNets, pNext );
}